

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char16_t * u16tou16_path(char16_t *source,char16_t *dest)

{
  char16_t cVar1;
  long lVar2;
  char16_t *pcVar3;
  char16_t *p1;
  long lVar4;
  
  if (source == (char16_t *)0x0 || dest == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    return (char16_t *)0x0;
  }
  pcVar3 = dest;
  if (*source != 0) {
    lVar4 = 0;
    do {
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (source[lVar2] != 0);
    if (0x103 < (int)lVar4) {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      return (char16_t *)0x0;
    }
  }
  do {
    cVar1 = *source;
    source = source + (cVar1 != 0);
    *dest = cVar1;
    dest = dest + 1;
  } while (*source != 0);
  return pcVar3;
}

Assistant:

char16_t *u16tou16_path(const char16_t *source, char16_t *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlenU16(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpyU16(dest, source);
}